

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rolemaskproxymodel.cpp
# Opt level: O2

void __thiscall
tst_RoleMaskProxyModel::testUseRoleMaskRecurse
          (tst_RoleMaskProxyModel *this,int magicNumber,QAbstractItemModel *baseModel,
          RoleMaskProxyModel *proxyModel,QModelIndexList *magicNumerIndexes,bool userRoleEditable,
          QModelIndex *srcParent,QModelIndex *prxParent)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  anon_union_24_3_e3d07ef4_for_data local_a0;
  QModelIndex proxyParent;
  anon_union_24_3_e3d07ef4_for_data local_68;
  QModelIndex baseParent;
  
  iVar3 = (**(code **)(*(long *)baseModel + 0x78))(baseModel,srcParent);
  iVar4 = (**(code **)(*(long *)baseModel + 0x80))(baseModel,srcParent);
  iVar7 = 0;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  do {
    if (iVar7 == iVar3) {
      return;
    }
    for (iVar6 = 0; iVar4 != iVar6; iVar6 = iVar6 + 1) {
      (**(code **)(*(long *)baseModel + 0x60))(&baseParent,baseModel,iVar7,iVar6,srcParent);
      (**(code **)(*(long *)proxyModel + 0x60))(&proxyParent,proxyModel,iVar7,iVar6,prxParent);
      bVar1 = QListSpecialMethodsBase<QModelIndex>::contains<QModelIndex>
                        ((QListSpecialMethodsBase<QModelIndex> *)magicNumerIndexes,&baseParent);
      if (bVar1) {
        QModelIndex::data((QVariant *)&local_a0,&proxyParent,0x100);
        iVar5 = QVariant::toInt((bool *)local_a0.data);
        cVar2 = QTest::qCompare(iVar5,magicNumber,"proxyParent.data(Qt::UserRole).toInt()",
                                "magicNumber",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                ,0x492);
        QVariant::~QVariant((QVariant *)&local_a0);
        if (cVar2 == '\0') {
          return;
        }
        if (userRoleEditable) {
          QModelIndex::data((QVariant *)&local_a0,&baseParent,0x100);
          iVar5 = QVariant::toInt((bool *)local_a0.data);
          cVar2 = QTest::qCompare(iVar5,~magicNumber,"baseParent.data(Qt::UserRole).toInt()",
                                  "~magicNumber",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                  ,0x494);
        }
        else {
          QModelIndex::data((QVariant *)&local_a0,&baseParent,0x100);
          iVar5 = QVariant::toInt((bool *)local_a0.data);
          cVar2 = QTest::qVerify(iVar5 != magicNumber,
                                 "baseParent.data(Qt::UserRole).toInt() != magicNumber","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                 ,0x496);
        }
      }
      else {
        QModelIndex::data((QVariant *)&local_a0,&proxyParent,0x100);
        QModelIndex::data((QVariant *)&local_68,&baseParent,0x100);
        cVar2 = QTest::qCompare<QVariant,QVariant>
                          ((QVariant *)&local_a0,(QVariant *)&local_68,
                           "proxyParent.data(Qt::UserRole)","baseParent.data(Qt::UserRole)",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                           ,0x498);
        QVariant::~QVariant((QVariant *)&local_68);
      }
      QVariant::~QVariant((QVariant *)&local_a0);
      if (cVar2 == '\0') {
        return;
      }
      QModelIndex::data((QVariant *)&local_a0,&proxyParent,0);
      QModelIndex::data((QVariant *)&local_68,&baseParent,0);
      bVar1 = QTest::qCompare<QVariant,QVariant>
                        ((QVariant *)&local_a0,(QVariant *)&local_68,"proxyParent.data()",
                         "baseParent.data()",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                         ,0x49a);
      QVariant::~QVariant((QVariant *)&local_68);
      QVariant::~QVariant((QVariant *)&local_a0);
      if (!bVar1) {
        return;
      }
      local_a0.data[0] = (**(code **)(*(long *)proxyModel + 0x88))(proxyModel,&proxyParent);
      local_68.data[0] = (**(code **)(*(long *)baseModel + 0x88))(baseModel,&baseParent);
      bVar1 = QTest::qCompare<bool,bool>
                        ((bool *)local_a0.data,(bool *)local_68.data,
                         "proxyModel->hasChildren(proxyParent)","baseModel->hasChildren(baseParent)"
                         ,
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                         ,0x49b);
      if (!bVar1) {
        return;
      }
      cVar2 = (**(code **)(*(long *)baseModel + 0x88))(baseModel,&baseParent);
      if (cVar2 != '\0') {
        testUseRoleMaskRecurse
                  (this,magicNumber,baseModel,proxyModel,magicNumerIndexes,userRoleEditable,
                   &baseParent,&proxyParent);
      }
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

void tst_RoleMaskProxyModel::testUseRoleMaskRecurse(const int magicNumber, const QAbstractItemModel *const baseModel,
                                                    const RoleMaskProxyModel *const proxyModel, const QModelIndexList &magicNumerIndexes,
                                                    const bool userRoleEditable, const QModelIndex &srcParent, const QModelIndex &prxParent)
{
    const int rowCnt = baseModel->rowCount(srcParent);
    const int colCnt = baseModel->columnCount(srcParent);
    for (int i = 0; i < rowCnt; ++i) {
        for (int j = 0; j < colCnt; ++j) {
            const QModelIndex baseParent = baseModel->index(i, j, srcParent);
            const QModelIndex proxyParent = proxyModel->index(i, j, prxParent);
            if (magicNumerIndexes.contains(baseParent)) {
                QCOMPARE(proxyParent.data(Qt::UserRole).toInt(), magicNumber);
                if (userRoleEditable)
                    QCOMPARE(baseParent.data(Qt::UserRole).toInt(), ~magicNumber);
                else
                    QVERIFY(baseParent.data(Qt::UserRole).toInt() != magicNumber);
            } else {
                QCOMPARE(proxyParent.data(Qt::UserRole), baseParent.data(Qt::UserRole));
            }
            QCOMPARE(proxyParent.data(), baseParent.data());
            QCOMPARE(proxyModel->hasChildren(proxyParent), baseModel->hasChildren(baseParent));
            if (baseModel->hasChildren(baseParent))
                testUseRoleMaskRecurse(magicNumber, baseModel, proxyModel, magicNumerIndexes, userRoleEditable, baseParent, proxyParent);
        }
    }
}